

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::TabBarProcessReorder(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  ImGuiID IVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  float fVar8;
  float fVar9;
  ImS16 IVar10;
  ImS16 IVar11;
  ImGuiTabItemFlags IVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  ImGuiID IVar16;
  ImGuiTabItemFlags IVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  ImGuiTabItem *pIVar24;
  ulong uVar25;
  ImGuiTabItem *unaff_R14;
  ImGuiTabItem *pIVar26;
  bool bVar27;
  ImGuiTabItem item_tmp;
  undefined1 uStack_19;
  
  IVar2 = tab_bar->ReorderRequestTabId;
  if (IVar2 != 0) {
    uVar22 = (ulong)(tab_bar->Tabs).Size;
    bVar27 = 0 < (long)uVar22;
    if (0 < (long)uVar22) {
      unaff_R14 = (tab_bar->Tabs).Data;
      bVar27 = true;
      if (unaff_R14->ID != IVar2) {
        pIVar24 = unaff_R14 + (uVar22 - 1);
        uVar20 = 1;
        pIVar26 = unaff_R14;
        do {
          uVar25 = uVar20;
          unaff_R14 = pIVar24;
          if (uVar22 == uVar25) break;
          unaff_R14 = pIVar26 + 1;
          pIVar1 = pIVar26 + 1;
          uVar20 = uVar25 + 1;
          pIVar26 = unaff_R14;
        } while (pIVar1->ID != IVar2);
        bVar27 = uVar25 < uVar22;
      }
    }
    if (bVar27) goto LAB_00166458;
  }
  unaff_R14 = (ImGuiTabItem *)0x0;
LAB_00166458:
  if ((unaff_R14 != (ImGuiTabItem *)0x0) && ((unaff_R14->Flags & 0x20) == 0)) {
    iVar21 = ImGuiTabBar::GetTabOrder(tab_bar,unaff_R14);
    uVar23 = tab_bar->ReorderRequestDir + iVar21;
    if ((-1 < (int)uVar23) && ((int)uVar23 < (tab_bar->Tabs).Size)) {
      pIVar26 = (tab_bar->Tabs).Data;
      uVar3 = pIVar26[uVar23].Flags;
      if (((uVar3 & 0x20) == 0) && (((uVar3 ^ unaff_R14->Flags) & 0xc0) == 0)) {
        pIVar26 = pIVar26 + uVar23;
        uVar4._0_2_ = unaff_R14->IndexDuringLayout;
        uVar4._2_1_ = unaff_R14->WantClose;
        uVar4._3_1_ = unaff_R14->field_0x23;
        IVar16 = unaff_R14->ID;
        IVar17 = unaff_R14->Flags;
        iVar18 = unaff_R14->LastFrameVisible;
        iVar19 = unaff_R14->LastFrameSelected;
        fVar14 = unaff_R14->Offset;
        fVar15 = unaff_R14->Width;
        uVar5 = unaff_R14->ContentWidth;
        uVar6 = unaff_R14->NameOffset;
        uVar7 = unaff_R14->BeginOrder;
        uStack_19 = (undefined1)((ushort)uVar7 >> 8);
        *(undefined4 *)((long)&unaff_R14->BeginOrder + 1) =
             *(undefined4 *)((long)&pIVar26->BeginOrder + 1);
        IVar2 = pIVar26->ID;
        IVar12 = pIVar26->Flags;
        iVar21 = pIVar26->LastFrameVisible;
        iVar13 = pIVar26->LastFrameSelected;
        fVar8 = pIVar26->Width;
        fVar9 = pIVar26->ContentWidth;
        IVar10 = pIVar26->NameOffset;
        IVar11 = pIVar26->BeginOrder;
        unaff_R14->Offset = pIVar26->Offset;
        unaff_R14->Width = fVar8;
        unaff_R14->ContentWidth = fVar9;
        unaff_R14->NameOffset = IVar10;
        unaff_R14->BeginOrder = IVar11;
        unaff_R14->ID = IVar2;
        unaff_R14->Flags = IVar12;
        unaff_R14->LastFrameVisible = iVar21;
        unaff_R14->LastFrameSelected = iVar13;
        *(uint *)((long)&pIVar26->BeginOrder + 1) = CONCAT31((int3)uVar4,uStack_19);
        pIVar26->Offset = fVar14;
        pIVar26->Width = fVar15;
        pIVar26->ContentWidth = (float)uVar5;
        pIVar26->NameOffset = uVar6;
        pIVar26->BeginOrder = uVar7;
        pIVar26->ID = IVar16;
        pIVar26->Flags = IVar17;
        pIVar26->LastFrameVisible = iVar18;
        pIVar26->LastFrameSelected = iVar19;
        if ((tab_bar->Flags & 0x400000) != 0) {
          MarkIniSettingsDirty();
        }
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ImGui::TabBarProcessReorder(ImGuiTabBar* tab_bar)
{
    ImGuiTabItem* tab1 = TabBarFindTabByID(tab_bar, tab_bar->ReorderRequestTabId);
    if (tab1 == NULL || (tab1->Flags & ImGuiTabItemFlags_NoReorder))
        return false;

    //IM_ASSERT(tab_bar->Flags & ImGuiTabBarFlags_Reorderable); // <- this may happen when using debug tools
    int tab2_order = tab_bar->GetTabOrder(tab1) + tab_bar->ReorderRequestDir;
    if (tab2_order < 0 || tab2_order >= tab_bar->Tabs.Size)
        return false;

    // Reordered TabItem must share the same position flags than target
    ImGuiTabItem* tab2 = &tab_bar->Tabs[tab2_order];
    if (tab2->Flags & ImGuiTabItemFlags_NoReorder)
        return false;
    if ((tab1->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)) != (tab2->Flags & (ImGuiTabItemFlags_Leading | ImGuiTabItemFlags_Trailing)))
        return false;

    ImGuiTabItem item_tmp = *tab1;
    *tab1 = *tab2;
    *tab2 = item_tmp;

    if (tab_bar->Flags & ImGuiTabBarFlags_SaveSettings)
        MarkIniSettingsDirty();
    return true;
}